

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *this)

{
  ProString::~ProString((ProString *)0x2259f0);
  QStringBuilder<ProString,_ProString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString_&> *)0x2259fa);
  return;
}

Assistant:

~QStringBuilder() = default;